

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

int soundfiler_writeascii(t_soundfiler *x,char *filename,t_asciiargs *a)

{
  int iVar1;
  _binbuf *x_00;
  int local_424;
  int local_41c;
  int ret;
  int frameswritten;
  int j;
  int i;
  _binbuf *b;
  char path [1000];
  t_asciiargs *a_local;
  char *filename_local;
  t_soundfiler *x_local;
  
  path._992_8_ = a;
  x_00 = binbuf_new();
  local_41c = 0;
  canvas_makefilename(x->x_canvas,filename,(char *)&b,1000);
  if (200000 < *(long *)(path._992_8_ + 8)) {
    post("warning: writing %d table points to ascii file!");
  }
  frameswritten = (int)*(undefined8 *)path._992_8_;
  for (; (long)local_41c < *(long *)(path._992_8_ + 8); local_41c = local_41c + 1) {
    for (ret = 0; ret < *(int *)(path._992_8_ + 0x10); ret = ret + 1) {
      binbuf_addv(x_00,"f",(double)(*(float *)(*(long *)(*(long *)(path._992_8_ + 0x18) +
                                                        (long)ret * 8) + (long)frameswritten * 8) *
                                   *(float *)(path._992_8_ + 0x38)));
    }
    frameswritten = frameswritten + 1;
  }
  binbuf_addv(x_00,";");
  iVar1 = binbuf_write(x_00,(char *)&b,"",1);
  binbuf_free(x_00);
  if (iVar1 == 0) {
    local_424 = local_41c;
  }
  else {
    local_424 = 0;
  }
  return local_424;
}

Assistant:

int soundfiler_writeascii(t_soundfiler *x, const char *filename, t_asciiargs *a)
{
    char path[MAXPDSTRING];
    t_binbuf *b = binbuf_new();
    int i, j, frameswritten = 0, ret = 1;
#ifdef DEBUG_SOUNDFILE
    post("ascii write: frames %d onset %d channels %d",
        a->aa_nframes, a->aa_onsetframe, a->aa_nchannels);
#endif
    canvas_makefilename(x->x_canvas, filename, path, MAXPDSTRING);
    if (a->aa_nframes > 200000)
        post("warning: writing %d table points to ascii file!");
    for (i = a->aa_onsetframe; frameswritten < a->aa_nframes; ++i)
    {
        for (j = 0; j < a->aa_nchannels; ++j)
            binbuf_addv(b, "f", a->aa_vectors[j][i].w_float * a->aa_normfactor);
        frameswritten++;
    }
    binbuf_addv(b, ";");
    ret = binbuf_write(b, path, "", 1); /* convert semis to cr */
    binbuf_free(b);
    return (ret == 0 ? frameswritten : 0);
}